

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_encoder.cc
# Opt level: O0

EncodedInfo * __thiscall
webrtc::AudioEncoder::Encode
          (EncodedInfo *__return_storage_ptr__,AudioEncoder *this,uint32_t rtp_timestamp,
          ArrayView<const_short> audio,Buffer *encoded)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  FatalMessage local_398;
  unsigned_long local_220;
  string *local_218;
  string *_result_1;
  undefined8 local_208;
  undefined1 local_1f9;
  size_t local_1f8;
  size_t old_size;
  ulong local_78;
  size_t local_70;
  string *local_68;
  string *_result;
  undefined1 local_50 [8];
  TraceEndOnScopeClose trace_event_unique_profileScope32;
  Buffer *encoded_local;
  uint32_t rtp_timestamp_local;
  AudioEncoder *this_local;
  ArrayView<const_short> audio_local;
  EncodedInfo *info;
  
  audio_local.data_ = (short *)audio.size_;
  this_local = (AudioEncoder *)audio.data_;
  trace_event_unique_profileScope32.data_.name = (char *)encoded;
  audio_local.size_ = (size_t)__return_storage_ptr__;
  if (Encode::trace_event_unique_catstatic32 == (uchar *)0x0) {
    Encode::trace_event_unique_catstatic32 = EventTracer::GetCategoryEnabled("webrtc");
  }
  trace_event_internal::TraceEndOnScopeClose::TraceEndOnScopeClose((TraceEndOnScopeClose *)local_50)
  ;
  if (*Encode::trace_event_unique_catstatic32 != '\0') {
    trace_event_internal::AddTraceEvent
              ('B',Encode::trace_event_unique_catstatic32,"AudioEncoder::Encode",0,'\0');
    trace_event_internal::TraceEndOnScopeClose::Initialize
              ((TraceEndOnScopeClose *)local_50,Encode::trace_event_unique_catstatic32,
               "AudioEncoder::Encode");
  }
  local_70 = rtc::ArrayView<const_short>::size((ArrayView<const_short> *)&this_local);
  iVar1 = (*this->_vptr_AudioEncoder[3])();
  iVar2 = (*this->_vptr_AudioEncoder[2])();
  local_78 = (ulong)(CONCAT44(extraout_var,iVar1) * (long)iVar2) / 100;
  local_68 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       (&local_70,&local_78,
                        "audio.size() == static_cast<size_t>(NumChannels() * SampleRateHz() / 100)")
  ;
  if (local_68 == (string *)0x0) {
    local_1f8 = rtc::Buffer::size((Buffer *)trace_event_unique_profileScope32.data_.name);
    local_1f9 = 0;
    rtc::ArrayView<short_const>::ArrayView<rtc::ArrayView<short_const>>
              ((ArrayView<short_const> *)&_result_1,(ArrayView<const_short> *)&this_local);
    (*this->_vptr_AudioEncoder[0xf])
              (__return_storage_ptr__,this,(ulong)rtp_timestamp,_result_1,local_208,
               trace_event_unique_profileScope32.data_.name);
    sVar3 = rtc::Buffer::size((Buffer *)trace_event_unique_profileScope32.data_.name);
    local_220 = sVar3 - local_1f8;
    local_218 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                          (&local_220,(unsigned_long *)__return_storage_ptr__,
                           "encoded->size() - old_size == info.encoded_bytes");
    if (local_218 == (string *)0x0) {
      local_1f9 = 1;
      trace_event_internal::TraceEndOnScopeClose::~TraceEndOnScopeClose
                ((TraceEndOnScopeClose *)local_50);
      return __return_storage_ptr__;
    }
    rtc::FatalMessage::FatalMessage
              (&local_398,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/audio_encoder.cc"
               ,0x26,local_218);
    rtc::FatalMessage::stream(&local_398);
    rtc::FatalMessage::~FatalMessage(&local_398);
  }
  rtc::FatalMessage::FatalMessage
            ((FatalMessage *)&old_size,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/audio_encoder.cc"
             ,0x22,local_68);
  rtc::FatalMessage::stream((FatalMessage *)&old_size);
  rtc::FatalMessage::~FatalMessage((FatalMessage *)&old_size);
}

Assistant:

AudioEncoder::EncodedInfo AudioEncoder::Encode(
    uint32_t rtp_timestamp,
    rtc::ArrayView<const int16_t> audio,
    rtc::Buffer* encoded) {
  TRACE_EVENT0("webrtc", "AudioEncoder::Encode");
  RTC_CHECK_EQ(audio.size(),
               static_cast<size_t>(NumChannels() * SampleRateHz() / 100));

  const size_t old_size = encoded->size();
  EncodedInfo info = EncodeImpl(rtp_timestamp, audio, encoded);
  RTC_CHECK_EQ(encoded->size() - old_size, info.encoded_bytes);
  return info;
}